

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void * duckdb_je_arena_ralloc
                 (tsdn_t *tsdn,arena_t *arena,void *ptr,size_t oldsize,size_t size,size_t alignment,
                 _Bool zero,_Bool slab,tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  cache_bin_stats_t *pcVar1;
  void **ppvVar2;
  void **ppvVar3;
  long lVar4;
  bool bVar5;
  _Bool _Var6;
  uint uVar7;
  szind_t ind;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  arena_t *paVar11;
  void *pvVar12;
  size_t sVar13;
  ulong uVar14;
  size_t size_00;
  cache_bin_t *pcVar15;
  rtree_t *rtree;
  rtree_contents_t local_1c8;
  size_t newsize;
  
  uVar10 = 0xf;
  if (alignment == 0) {
    if (size < 0x1001) {
      size_00 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) goto LAB_001f75e3;
      uVar8 = size * 2 - 1;
      lVar4 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar8 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
      if ((uint)lVar4 < 7) {
        uVar8 = uVar10;
      }
      size_00 = ~uVar8 & uVar8 + size;
    }
  }
  else {
    if (alignment < 0x1001 && size < 0x3801) {
      uVar8 = -alignment & (size + alignment) - 1;
      if (uVar8 < 0x1001) {
        size_00 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar8 + 7 >> 3]];
      }
      else if (uVar8 < 0x7000000000000001) {
        uVar14 = uVar8 * 2 - 1;
        lVar4 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        uVar14 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
        if ((uint)lVar4 < 7) {
          uVar14 = uVar10;
        }
        size_00 = ~uVar14 & uVar8 + uVar14;
      }
      else {
        size_00 = 0;
      }
      if (size_00 < 0x4000) goto LAB_001f764a;
    }
    if (alignment < 0x7000000000000001) {
      uVar8 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar8 = size * 2 - 1;
          lVar4 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          uVar8 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
          if ((uint)lVar4 < 7) {
            uVar8 = uVar10;
          }
          uVar8 = ~uVar8 & uVar8 + size;
        }
        else {
          uVar8 = 0;
        }
        if (uVar8 < size) goto LAB_001f75e3;
      }
      size_00 = 0;
      if (uVar8 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar8) -
                   0x1000) {
        size_00 = uVar8;
      }
    }
    else {
LAB_001f75e3:
      size_00 = 0;
    }
  }
LAB_001f764a:
  if (0x7000000000000000 < size) {
    return (void *)0x0;
  }
  if (size_00 == 0) {
    return (void *)0x0;
  }
  uVar7 = (uint)zero;
  if (slab) {
    size = 0;
    _Var6 = duckdb_je_arena_ralloc_no_move(tsdn,ptr,oldsize,size_00,0,zero,&newsize);
    if (!_Var6) {
      duckdb_je_hook_invoke_expand
                (hook_args->is_realloc ^ hook_expand_rallocx,ptr,oldsize,size_00,(uintptr_t)ptr,
                 hook_args->args);
      return ptr;
    }
  }
  if ((0x3fff < oldsize) && (0x3fff < size_00)) {
    pvVar9 = duckdb_je_large_ralloc(tsdn,arena,ptr,size_00,alignment,zero,tcache,hook_args);
    return pvVar9;
  }
  if (alignment == 0) {
    if (size_00 < 0x1001) {
      ind = (szind_t)duckdb_je_sz_size2index_tab[size_00 + 7 >> 3];
    }
    else {
      ind = sz_size2index_compute(size_00);
    }
    if (tcache == (tcache_t *)0x0) goto LAB_001f7be3;
    uVar10 = (ulong)ind;
    if (!slab) {
      if (tcache->tcache_slow->tcache_nbins <= ind) {
LAB_001f7be3:
        size = (size_t)uVar7;
        pvVar9 = duckdb_je_arena_malloc_hard(tsdn,arena,size_00,ind,zero,slab);
        goto LAB_001f78f5;
      }
      size = uVar10 * 0x18;
      ppvVar3 = tcache->bins[uVar10].stack_head;
      if (ppvVar3 == (void **)&duckdb_je_disabled_bin) goto LAB_001f7be3;
      pcVar15 = tcache->bins + uVar10;
      pvVar9 = *ppvVar3;
      ppvVar2 = ppvVar3 + 1;
      if (tcache->bins[uVar10].low_bits_low_water == (uint16_t)ppvVar3) {
        if (tcache->bins[uVar10].low_bits_empty != (uint16_t)ppvVar3) {
          pcVar15->stack_head = ppvVar2;
          tcache->bins[uVar10].low_bits_low_water = (uint16_t)ppvVar2;
          goto LAB_001f7bc2;
        }
        bVar5 = false;
        pvVar9 = (void *)0x0;
      }
      else {
        pcVar15->stack_head = ppvVar2;
LAB_001f7bc2:
        bVar5 = true;
      }
      if (bVar5) {
        if (zero) {
          switchD_005700f1::default(pvVar9,0,duckdb_je_sz_index2size_tab[uVar10]);
        }
        pcVar1 = &tcache->bins[uVar10].tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
        goto LAB_001f78f5;
      }
      paVar11 = arena_choose(&tsdn->tsd,arena);
      if (paVar11 != (arena_t *)0x0) {
        size = 0;
        duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,pcVar15,ind,false);
        if (size_00 < 0x1001) {
          sVar13 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size_00 + 7 >> 3]];
        }
        else if (size_00 < 0x7000000000000001) {
          uVar10 = size_00 * 2 - 1;
          lVar4 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          uVar10 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
          if ((uint)lVar4 < 7) {
            uVar10 = 0xf;
          }
          sVar13 = ~uVar10 & uVar10 + size_00;
        }
        else {
          sVar13 = 0;
        }
        pvVar9 = duckdb_je_large_malloc(tsdn,paVar11,sVar13,zero);
        goto LAB_001f78f5;
      }
      goto LAB_001f7de0;
    }
    pcVar15 = tcache->bins + uVar10;
    ppvVar2 = pcVar15->stack_head;
    pvVar12 = *ppvVar2;
    ppvVar3 = ppvVar2 + 1;
    if (tcache->bins[uVar10].low_bits_low_water == (uint16_t)ppvVar2) {
      if (tcache->bins[uVar10].low_bits_empty != (uint16_t)ppvVar2) {
        pcVar15->stack_head = ppvVar3;
        tcache->bins[uVar10].low_bits_low_water = (uint16_t)ppvVar3;
        goto LAB_001f7860;
      }
      bVar5 = false;
      pvVar12 = (void *)0x0;
    }
    else {
      pcVar15->stack_head = ppvVar3;
LAB_001f7860:
      bVar5 = true;
    }
    if (!bVar5) {
      paVar11 = arena_choose(&tsdn->tsd,arena);
      if (paVar11 == (arena_t *)0x0) {
        newsize._0_1_ = '\0';
LAB_001f7c97:
        pvVar9 = (void *)0x0;
      }
      else {
        if (pcVar15->stack_head != (void **)&duckdb_je_disabled_bin) {
          duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,pcVar15,ind,true);
          size = (size_t)ind;
          pvVar12 = duckdb_je_tcache_alloc_small_hard
                              (tsdn,paVar11,tcache,pcVar15,ind,(_Bool *)&newsize);
          goto LAB_001f7c97;
        }
        size = (size_t)uVar7;
        pvVar9 = duckdb_je_arena_malloc_hard(tsdn,paVar11,size_00,ind,zero,true);
        newsize._0_1_ = '\0';
      }
      if ((char)newsize == '\0') goto LAB_001f78f5;
    }
    pvVar9 = pvVar12;
    if (zero) {
      switchD_005700f1::default(pvVar9,0,duckdb_je_sz_index2size_tab[uVar10]);
    }
    pcVar1 = &tcache->bins[uVar10].tstats;
    pcVar1->nrequests = pcVar1->nrequests + 1;
  }
  else {
    if ((alignment < 0x1001) && (size_00 < 0x3801)) {
      uVar10 = -alignment & (size_00 + alignment) - 1;
      if (uVar10 < 0x1001) {
        sVar13 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar10 + 7 >> 3]];
      }
      else if (uVar10 < 0x7000000000000001) {
        uVar8 = uVar10 * 2 - 1;
        lVar4 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        uVar8 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
        if ((uint)lVar4 < 7) {
          uVar8 = 0xf;
        }
        sVar13 = ~uVar8 & uVar10 + uVar8;
      }
      else {
        sVar13 = 0;
      }
      if (0x3fff < sVar13) goto LAB_001f778a;
    }
    else {
LAB_001f778a:
      if (alignment < 0x7000000000000001) {
        uVar10 = 0x4000;
        if (0x4000 < size_00) {
          if (size_00 < 0x7000000000000001) {
            uVar10 = size_00 * 2 - 1;
            lVar4 = 0x3f;
            if (uVar10 != 0) {
              for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
              }
            }
            uVar10 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
            if ((uint)lVar4 < 7) {
              uVar10 = 0xf;
            }
            uVar10 = ~uVar10 & uVar10 + size_00;
          }
          else {
            uVar10 = 0;
          }
          if (uVar10 < size_00) goto LAB_001f77f8;
        }
        size = 0x7ffffffffffff000;
        sVar13 = 0;
        if (uVar10 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar10) -
                      0x1000) {
          sVar13 = uVar10;
        }
      }
      else {
LAB_001f77f8:
        sVar13 = 0;
      }
    }
    if (sVar13 + 0x8fffffffffffffff < 0x9000000000000000) {
LAB_001f7de0:
      pvVar9 = (void *)0x0;
    }
    else {
      size = (size_t)uVar7;
      pvVar9 = duckdb_je_arena_palloc(tsdn,arena,sVar13,alignment,zero,slab,tcache);
    }
  }
LAB_001f78f5:
  if (pvVar9 == (void *)0x0) {
    return (void *)0x0;
  }
  duckdb_je_hook_invoke_alloc
            (hook_args->is_realloc ^ hook_alloc_rallocx,pvVar9,(uintptr_t)pvVar9,hook_args->args);
  duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (oldsize <= size_00) {
    size_00 = oldsize;
  }
  switchD_00b1422a::default(pvVar9,ptr,size_00);
  if (tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache(tsdn,ptr,oldsize);
    return pvVar9;
  }
  if (oldsize < 0x1001) {
    uVar7 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
  }
  else {
    uVar7 = sz_size2index_compute(oldsize);
  }
  if (uVar7 < 0x24) {
    pcVar15 = tcache->bins + uVar7;
    ppvVar3 = pcVar15->stack_head;
    if (tcache->bins[uVar7].low_bits_full != (uint16_t)ppvVar3) {
      pcVar15->stack_head = ppvVar3 + -1;
      ppvVar3[-1] = ptr;
      return pvVar9;
    }
    if (pcVar15->stack_head == (void **)&duckdb_je_disabled_bin) {
      duckdb_je_arena_dalloc_small(tsdn,ptr);
      return pvVar9;
    }
    duckdb_je_tcache_bin_flush_small
              (&tsdn->tsd,tcache,pcVar15,uVar7,
               (uint)(tcache->bins[uVar7].bin_info.ncached_max >>
                     ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_001f7aee:
    ppvVar3 = pcVar15->stack_head;
    if (pcVar15->low_bits_full != (uint16_t)ppvVar3) {
      pcVar15->stack_head = ppvVar3 + -1;
      ppvVar3[-1] = ptr;
    }
  }
  else {
    if (uVar7 < tcache->tcache_slow->tcache_nbins) {
      ppvVar3 = tcache->bins[uVar7].stack_head;
      if (ppvVar3 != (void **)&duckdb_je_disabled_bin) {
        pcVar15 = tcache->bins + uVar7;
        if (tcache->bins[uVar7].low_bits_full != (uint16_t)ppvVar3) {
          pcVar15->stack_head = ppvVar3 + -1;
          ppvVar3[-1] = ptr;
          return pvVar9;
        }
        duckdb_je_tcache_bin_flush_large
                  (&tsdn->tsd,tcache,pcVar15,uVar7,
                   (uint)(tcache->bins[uVar7].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_001f7aee;
      }
    }
    if (tsdn == (tsdn_t *)0x0) {
      rtree = (rtree_t *)&newsize;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
    }
    else {
      rtree = (rtree_t *)
              &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,tsdn,rtree,(rtree_ctx_t *)ptr,size);
    duckdb_je_large_dalloc(tsdn,local_1c8.edata);
  }
  return pvVar9;
}

Assistant:

void *
arena_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t oldsize,
    size_t size, size_t alignment, bool zero, bool slab, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	size_t usize = alignment == 0 ? sz_s2u(size) : sz_sa2u(size, alignment);
	if (unlikely(usize == 0 || size > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(slab)) {
		assert(sz_can_use_slab(usize));
		/* Try to avoid moving the allocation. */
		UNUSED size_t newsize;
		if (!arena_ralloc_no_move(tsdn, ptr, oldsize, usize, 0, zero,
		    &newsize)) {
			hook_invoke_expand(hook_args->is_realloc
			    ? hook_expand_realloc : hook_expand_rallocx,
			    ptr, oldsize, usize, (uintptr_t)ptr,
			    hook_args->args);
			return ptr;
		}
	}

	if (oldsize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS) {
		return large_ralloc(tsdn, arena, ptr, usize,
		    alignment, zero, tcache, hook_args);
	}

	/*
	 * size and oldsize are different enough that we need to move the
	 * object.  In that case, fall back to allocating new space and copying.
	 */
	void *ret = arena_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero, slab, tcache);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	/*
	 * Junk/zero-filling were already done by
	 * ipalloc()/arena_malloc().
	 */
	size_t copysize = (usize < oldsize) ? usize : oldsize;
	memcpy(ret, ptr, copysize);
	isdalloct(tsdn, ptr, oldsize, tcache, NULL, true);
	return ret;
}